

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::JsonUnitTestResultPrinter::EscapeJson
                   (string *__return_storage_ptr__,string *str)

{
  ostream *poVar1;
  byte bVar2;
  uchar value;
  ulong uVar3;
  char *pcVar4;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_58;
  string local_50;
  
  Message::Message((Message *)&local_58);
  poVar1 = (ostream *)(local_58._M_head_impl + 0x10);
  uVar3 = 0;
  do {
    if (str->_M_string_length <= uVar3) {
      StringStreamToString(__return_storage_ptr__,local_58._M_head_impl);
      if (local_58._M_head_impl != (stringstream *)0x0) {
        (**(code **)(*(long *)local_58._M_head_impl + 8))(local_58._M_head_impl);
      }
      return __return_storage_ptr__;
    }
    bVar2 = (str->_M_dataplus)._M_p[uVar3];
    pcVar4 = "\\t";
    switch(bVar2) {
    case 8:
      pcVar4 = "\\b";
      break;
    case 9:
      break;
    case 10:
      pcVar4 = "\\n";
      break;
    case 0xb:
switchD_0011a455_caseD_b:
      if ((char)bVar2 < ' ') {
        std::operator<<(poVar1,"\\u00");
        String::FormatByte_abi_cxx11_(&local_50,(String *)(ulong)bVar2,value);
        std::operator<<(poVar1,(string *)&local_50);
        std::__cxx11::string::~string((string *)&local_50);
      }
      else {
        std::operator<<(poVar1,bVar2);
      }
      goto LAB_0011a4eb;
    case 0xc:
      pcVar4 = "\\f";
      break;
    case 0xd:
      pcVar4 = "\\r";
      break;
    default:
      if ((0x3a < bVar2 - 0x22) || ((0x400000000002001U >> ((ulong)(bVar2 - 0x22) & 0x3f) & 1) == 0)
         ) goto switchD_0011a455_caseD_b;
      std::operator<<(poVar1,'\\');
      std::operator<<(poVar1,bVar2);
      goto LAB_0011a4eb;
    }
    std::operator<<(poVar1,pcVar4);
LAB_0011a4eb:
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

std::string JsonUnitTestResultPrinter::EscapeJson(const std::string& str) {
  Message m;

  for (size_t i = 0; i < str.size(); ++i) {
    const char ch = str[i];
    switch (ch) {
      case '\\':
      case '"':
      case '/':
        m << '\\' << ch;
        break;
      case '\b':
        m << "\\b";
        break;
      case '\t':
        m << "\\t";
        break;
      case '\n':
        m << "\\n";
        break;
      case '\f':
        m << "\\f";
        break;
      case '\r':
        m << "\\r";
        break;
      default:
        if (ch < ' ') {
          m << "\\u00" << String::FormatByte(static_cast<unsigned char>(ch));
        } else {
          m << ch;
        }
        break;
    }
  }

  return m.GetString();
}